

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BarrierCase::iterate(BarrierCase *this)

{
  TestLog *log;
  RenderContext *rCtx;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  int i;
  long lVar5;
  char *description;
  Surface rendered;
  vector<float,_std::allocator<float>_> attributeData;
  undefined1 local_c0 [40];
  RandomViewport viewport;
  VertexArrayBinding attrBindings [1];
  undefined4 extraout_var_00;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  rCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*rCtx->_vptr_RenderContext[4])(rCtx);
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar2),0x100,0x100,dVar3);
  dVar3 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar2 = (*rCtx->_vptr_RenderContext[3])(rCtx);
  lVar4 = CONCAT44(extraout_var_00,iVar2);
  (**(code **)(lVar4 + 0x1a00))(viewport.x,viewport.y,viewport.width);
  (**(code **)(lVar4 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar4 + 0x1680))(dVar3);
  std::vector<float,_std::allocator<float>_>::vector
            (&attributeData,0x20,(allocator_type *)attrBindings);
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
    attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = (float)(int)lVar5 / 31.0;
  }
  (**(code **)(lVar4 + 0xfd8))(0x8e72,0x20);
  (**(code **)(lVar4 + 0x188))(0x4000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"in_v_attr",(allocator<char> *)&rendered);
  glu::va::Float(attrBindings,(string *)local_c0,1,
                 (int)((ulong)((long)attributeData.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)attributeData.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2),0,
                 attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)local_c0);
  local_c0._0_4_ = RGB;
  local_c0._4_4_ = UNSIGNED_INT24;
  local_c0._8_4_ = INDEXTYPE_LAST;
  local_c0._16_8_ = 0;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar3,1,attrBindings,
            (PrimitiveList *)local_c0,(DrawUtilCallback *)0x0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0xd9f);
  std::__cxx11::string::~string((string *)&attrBindings[0].binding.name);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&attributeData.super__Vector_base<float,_std::allocator<float>_>);
  getPixels(&rendered,rCtx,&viewport);
  getPNG((TextureLevel *)attrBindings,
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive,
         &this->m_referenceImagePath);
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_c0,(TextureLevel *)attrBindings);
  tcu::Surface::getAccess((ConstPixelBufferAccess *)&attributeData,&rendered);
  bVar1 = tcu::fuzzyCompare(log,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_c0,
                            (ConstPixelBufferAccess *)&attributeData,0.02,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::TextureLevel::~TextureLevel((TextureLevel *)attrBindings);
  tcu::Surface::~Surface(&rendered);
  return STOP;
}

Assistant:

BarrierCase::IterateResult BarrierCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	{
		vector<float> attributeData(NUM_VERTICES);

		for (int i = 0; i < NUM_VERTICES; i++)
			attributeData[i] = (float)i / (float)(NUM_VERTICES-1);

		gl.patchParameteri(GL_PATCH_VERTICES, NUM_VERTICES);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_attr", 1, (int)attributeData.size(), 0, &attributeData[0])
		};

		glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches(NUM_VERTICES));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
		const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath);
		const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

		m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image comparison failed");
		return STOP;
	}
}